

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPRequest::getp_getCookies
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  char *buf;
  uint uVar1;
  long lVar2;
  CVmObjPageEntry *pCVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  char cVar7;
  int iVar8;
  vm_obj_id_t vVar9;
  void *pvVar10;
  size_t len;
  char *pcVar11;
  undefined8 *puVar12;
  char *str;
  char *str_00;
  char *pcVar13;
  bool bVar14;
  vm_val_t local_40;
  
  if (getp_getCookies(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getCookies();
  }
  iVar8 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getCookies::desc);
  if (iVar8 == 0) {
    lVar2 = *(long *)(*(long *)(this->super_CVmObject).ext_ + 0x58);
    vVar9 = CVmObjLookupTable::create(0,0x20,0x40);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar9;
    pvVar6 = sp_;
    uVar5 = *(undefined4 *)&retval->field_0x4;
    aVar4 = retval->val;
    sp_ = sp_ + 1;
    pvVar6->typ = retval->typ;
    *(undefined4 *)&pvVar6->field_0x4 = uVar5;
    pvVar6->val = aVar4;
    puVar12 = *(undefined8 **)(lVar2 + 0x10);
    if (puVar12 != (undefined8 *)0x0) {
      uVar1 = (retval->val).obj;
      pCVar3 = G_obj_table_X.pages_[uVar1 >> 0xc];
      do {
        iVar8 = stricmp((char *)*puVar12,"cookie");
        if (iVar8 == 0) {
          pcVar13 = (char *)puVar12[1];
          while (*pcVar13 != '\0') {
            do {
              str_00 = pcVar13;
              iVar8 = isspace((int)*str_00);
              pcVar13 = str_00 + 1;
            } while (iVar8 != 0);
            cVar7 = *str_00;
            pcVar11 = str_00;
            if (cVar7 == '\0') {
              bVar14 = false;
            }
            else {
              do {
                pvVar10 = memchr("=;,",(int)cVar7,4);
                if (pvVar10 != (void *)0x0) break;
                cVar7 = pcVar11[1];
                pcVar11 = pcVar11 + 1;
              } while (cVar7 != '\0');
              bVar14 = cVar7 == '=';
            }
            if (bVar14) {
              str = pcVar11 + 1;
              cVar7 = pcVar11[1];
              pcVar13 = str;
              while ((cVar7 != '\0' &&
                     (pvVar10 = memchr(" \t;,",(int)cVar7,5), pvVar10 == (void *)0x0))) {
                cVar7 = pcVar13[1];
                pcVar13 = pcVar13 + 1;
              }
              len = (long)pcVar13 - (long)str;
            }
            else {
              str = "";
              len = 0;
              pcVar13 = pcVar11;
            }
            local_40.val.obj = CVmObjString::create(0,str_00,(long)pcVar11 - (long)str_00);
            local_40.typ = VM_OBJ;
            lVar2 = *(long *)((long)&G_obj_table_X.pages_[local_40.val.obj >> 0xc]
                                     [local_40.val.obj & 0xfff].ptr_ + 8);
            buf = (char *)(lVar2 + 2);
            CCharmapToUni::validate(buf,((((long)pcVar11 - (long)str_00) + lVar2) - (long)buf) + 2);
            add_parsed_val((CVmObjLookupTable *)
                           ((long)&pCVar3->ptr_ + (ulong)((uVar1 & 0xfff) * 0x18)),&local_40,str,len
                           ,0);
            cVar7 = *pcVar13;
            while ((cVar7 != '\0' &&
                   (pvVar10 = memchr(" \t;,",(int)cVar7,5), pvVar10 != (void *)0x0))) {
              cVar7 = pcVar13[1];
              pcVar13 = pcVar13 + 1;
            }
          }
        }
        puVar12 = (undefined8 *)puVar12[2];
      } while (puVar12 != (undefined8 *)0x0);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getCookies(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* scan for "Cookie" headers */
    for (hdrs = hdrs->nxt ; hdrs != 0 ; hdrs = hdrs->nxt)
    {
        /* if this is a Cookie: header, process it */
        if (stricmp(hdrs->name, "cookie") == 0)
        {
            /* scan the list of cookie name=value pairs */
            for (const char *p = hdrs->value ; *p != '\0' ; )
            {
                /* skip leading whitespace */
                for ( ; isspace(*p) ; ++p) ;

                /* the cookie name ends at the '=', ';', ',', or null */
                const char *name = p;
                for ( ; *p != '\0' && strchr("=;,", *p) == 0 ; ++p) ;
                size_t namelen = p - name;

                /* if we found the '=', scan the value */
                const char *val = "";
                size_t vallen = 0;
                if (*p == '=')
                {
                    /* skip the '=' and scan for the end of the cookie */
                    for (val = ++p ; *p != '\0' && strchr(" \t;,", *p) == 0 ;
                         ++p) ;
                    vallen = p - val;
                }

                /* add this cookie to the table */
                add_parsed_val(vmg_ tab, name, namelen, val, vallen,
                               ENCMODE_NONE);

                /* scan ahead to the next non-delimiter */
                for ( ; *p != '\0' && strchr(" \t;,", *p) != 0 ; ++p) ;
            }
        }
    }

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}